

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsFMVolEnv(uint arg_count,long *arg_array)

{
  long *arg_array_local;
  uint arg_count_local;
  
  if (1 < arg_count) {
    if (target_driver < 3) {
      PrintError("Error: smpsFMVolEnv is not supported in Sonic 1 or Sonic 2\'s driver\n");
    }
    WriteByte(0xff);
    WriteByte('\x06');
    WriteByte((uchar)*arg_array);
    WriteByte((uchar)arg_array[1]);
    return;
  }
  __assert_fail("arg_count >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x419,"void Macro_smpsFMVolEnv(unsigned int, long *)");
}

Assistant:

static void Macro_smpsFMVolEnv(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 2);

	if (target_driver < 3)
		PrintError("Error: smpsFMVolEnv is not supported in Sonic 1 or Sonic 2's driver\n");

	WriteByte(0xFF);
	WriteByte(0x06);
	WriteByte(arg_array[0]);
	WriteByte(arg_array[1]);
}